

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O2

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  long *plVar1;
  int iVar2;
  poll_ctx *ctx;
  uv_fs_poll_t *handle_local;
  
  iVar2 = uv_is_active((uv_handle_t *)handle);
  if (iVar2 != 0) {
    plVar1 = (long *)handle->poll_ctx;
    if (plVar1 == (long *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/fs-poll.c"
                    ,0x7b,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    if ((uv_fs_poll_t *)*plVar1 != handle) {
      __assert_fail("ctx->parent_handle == handle",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/fs-poll.c"
                    ,0x7c,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    iVar2 = uv_is_active((uv_handle_t *)(plVar1 + 5));
    if (iVar2 != 0) {
      uv_close((uv_handle_t *)(plVar1 + 5),timer_close_cb);
    }
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
  }
  return 0;
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv_is_active((uv_handle_t*)handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle == handle);

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv_is_active((uv_handle_t*)&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}